

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

treeNode * forStmt(void)

{
  int iVar1;
  treeNode *this;
  treeNode *ptVar2;
  treeNode *ptVar3;
  treeNode *extraout_RAX;
  double __x;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  this = (treeNode *)operator_new(0x58);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
  treeNode::treeNode(this,forRpt,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  ptVar2 = (treeNode *)operator_new(0x58);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"forExp","");
  treeNode::treeNode(ptVar2,forRpt,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  this->child[0] = ptVar2;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"for","");
  match(&local_40,Empty);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"(","");
  match(&local_60,Empty);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  ptVar3 = statement();
  ptVar2->child[0] = ptVar3;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,";","");
  match(&local_80,lackSem);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  iVar1 = std::__cxx11::string::compare((char *)&nextToken.text);
  if (iVar1 == 0) {
    ptVar3 = (treeNode *)0x0;
  }
  else {
    exp(__x);
    ptVar3 = extraout_RAX;
  }
  ptVar2->child[1] = ptVar3;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,";","");
  match(&local_a0,lackSem);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  ptVar3 = statement();
  ptVar2->child[2] = ptVar3;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,")","");
  match(&local_c0,lackRightBucket);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  ptVar2 = statementClosure();
  this->child[1] = ptVar2;
  return this;
}

Assistant:

treeNode* forStmt()
{
    auto ret = new treeNode(StmtKind::forRpt,"");
    auto forExp = new treeNode(StmtKind::forRpt,"forExp");
    ret->child[0]=forExp;
    match("for");
    match("(");
    forExp->child[0]=statement();
    match(";",Error::lackSem);
    forExp->child[1]=(nextToken.text==";"?nullptr:exp());
    match(";",Error::lackSem);
    forExp->child[2]=statement();
    match(")",Error::lackRightBucket);
    ret->child[1]=statementClosure();
    return ret;
}